

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  int h;
  int bytes_per_pixel;
  int iVar1;
  stbi__context *__src;
  int *piVar2;
  int iVar3;
  long lVar4;
  size_t __size;
  int *two_back;
  long lVar5;
  size_t __size_00;
  uchar *image;
  stbi__context s;
  uchar *local_89a8;
  stbi__context local_8978;
  stbi__gif local_88a0;
  
  local_8978.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_8978.read_from_callbacks = 0;
  local_8978.img_buffer_end = buffer + len;
  two_back = y;
  local_8978.img_buffer = buffer;
  local_8978.img_buffer_original = buffer;
  local_8978.img_buffer_original_end = local_8978.img_buffer_end;
  iVar1 = stbi__gif_test(&local_8978);
  if (iVar1 == 0) {
    stbi__g_failure_reason = "not GIF";
    local_89a8 = (uchar *)0x0;
  }
  else {
    lVar5 = 0;
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    __src = (stbi__context *)stbi__gif_load_next(&local_8978,&local_88a0,comp,0,(stbi_uc *)two_back)
    ;
    local_89a8 = (uchar *)0x0;
    if (__src != (stbi__context *)0x0 && __src != &local_8978) {
      __size_00 = 4;
      lVar5 = 0;
      lVar4 = 0;
      local_89a8 = (uchar *)0x0;
      do {
        *x = local_88a0.w;
        *y = local_88a0.h;
        iVar3 = local_88a0.h * local_88a0.w;
        iVar1 = iVar3 * 4;
        __size = (size_t)(((int)lVar5 + 1) * iVar1);
        if (local_89a8 == (uchar *)0x0) {
          local_89a8 = (uchar *)malloc(__size);
          if (delays != (int **)0x0) {
            piVar2 = (int *)malloc(__size_00);
            goto LAB_002626bd;
          }
        }
        else {
          local_89a8 = (uchar *)realloc(local_89a8,__size);
          if (delays != (int **)0x0) {
            piVar2 = (int *)realloc(*delays,__size_00);
LAB_002626bd:
            *delays = piVar2;
          }
        }
        memcpy(local_89a8 + (int)lVar5 * iVar1,__src,(long)iVar1);
        if (lVar5 != 0) {
          lVar4 = (long)local_89a8 - (long)(iVar3 * 8);
        }
        if (delays != (int **)0x0) {
          (*delays)[lVar5] = local_88a0.delay;
        }
        __src = (stbi__context *)
                stbi__gif_load_next(&local_8978,&local_88a0,comp,(int)lVar4,(stbi_uc *)two_back);
        lVar5 = lVar5 + 1;
      } while ((__src != &local_8978) && (__size_00 = __size_00 + 4, __src != (stbi__context *)0x0))
      ;
    }
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      local_89a8 = stbi__convert_format
                             (local_89a8,4,req_comp,local_88a0.w * (int)lVar5,local_88a0.h);
    }
    *z = (int)lVar5;
  }
  if ((stbi__vertically_flip_on_load != 0) && (iVar1 = *z, 0 < iVar1)) {
    iVar3 = *x;
    h = *y;
    bytes_per_pixel = *comp;
    image = local_89a8;
    do {
      stbi__vertical_flip(image,iVar3,h,bytes_per_pixel);
      image = image + h * iVar3 * bytes_per_pixel;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return local_89a8;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s; 
   stbi__start_mem(&s,buffer,len); 
   
   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp ); 
   }

   return result; 
}